

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O3

void destroyUploadToBlobContextInstance(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *uploadContext)

{
  if (uploadContext != (IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT *)0x0) {
    HTTPAPIEX_Destroy(uploadContext->blobHttpApiHandle);
    if (uploadContext->blockIdList != (SINGLYLINKEDLIST_HANDLE)0x0) {
      Blob_ClearBlockIdList(uploadContext->blockIdList);
      singlylinkedlist_destroy(uploadContext->blockIdList);
    }
    free(uploadContext->blobStorageHostname);
    free(uploadContext->blobStorageRelativePath);
    free(uploadContext);
    return;
  }
  return;
}

Assistant:

static void destroyUploadToBlobContextInstance(IOTHUB_CLIENT_LL_UPLOADTOBLOB_CONTEXT* uploadContext)
{
    if (uploadContext != NULL)
    {
        HTTPAPIEX_Destroy(uploadContext->blobHttpApiHandle);

        if (uploadContext->blockIdList != NULL)
        {
            Blob_ClearBlockIdList(uploadContext->blockIdList);
            singlylinkedlist_destroy(uploadContext->blockIdList);
        }

        free(uploadContext->blobStorageHostname);
        free(uploadContext->blobStorageRelativePath);
        free(uploadContext);
    }
}